

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_test.cpp
# Opt level: O0

int findParam(string *param,int argc,char **argv)

{
  __type _Var1;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  int idx;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar2;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  
  local_1c = -1;
  for (local_20 = 0; uVar2 = local_20 < in_ESI && local_1c == -1,
      local_20 < in_ESI && local_1c == -1; local_20 = local_20 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    _Var1 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(uVar2,in_stack_ffffffffffffff98));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    if (_Var1) {
      local_1c = local_20;
    }
  }
  return local_1c;
}

Assistant:

int findParam ( string param,int argc,char **argv ) {
    int idx=-1;
    for ( int i=0; i<argc && idx==-1; i++ )
        if ( string ( argv[i] ) ==param ) idx=i;
    return idx;

}